

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O2

void __thiscall helics::CommsInterface::disconnect(CommsInterface *this)

{
  bool bVar1;
  rep in_RAX;
  uint uVar2;
  string_view message;
  string_view message_00;
  milliseconds local_28;
  
  local_28.__r = in_RAX;
  if ((((this->operating)._M_base._M_i & 1U) == 0) && (bVar1 = propertyLock(this), bVar1)) {
    setRxStatus(this,TERMINATED);
    setTxStatus(this,TERMINATED);
    propertyUnLock(this);
    join_tx_rx_thread(this);
    return;
  }
  (this->requestDisconnect)._M_base._M_i = true;
  if ((this->rxStatus)._M_i < RECONNECTING) {
    (*this->_vptr_CommsInterface[7])(this);
  }
  if ((this->txStatus)._M_i < RECONNECTING) {
    (*this->_vptr_CommsInterface[6])(this);
  }
  if (((((this->tripDetector).lineDetector.
         super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_base).
       _M_i & 1U) != 0) {
    setRxStatus(this,TERMINATED);
    setTxStatus(this,TERMINATED);
    return;
  }
  uVar2 = 0;
  do {
    do {
      if (CONNECTED < (this->rxStatus)._M_i) {
LAB_0027df25:
        uVar2 = 0;
        goto LAB_0027df31;
      }
      local_28.__r = 800;
      bVar1 = gmlc::concurrency::TriggerVariable::wait_for(&this->rxTrigger,&local_28);
    } while (bVar1);
    uVar2 = uVar2 + 1;
    if ((uVar2 & 3) == 0) {
      (*this->_vptr_CommsInterface[7])(this);
    }
    if (uVar2 == 0xe) {
      message._M_str = "unable to terminate receiver connection";
      message._M_len = 0x27;
      logError(this,message);
      goto LAB_0027df25;
    }
  } while (((((this->tripDetector).lineDetector.
              super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _M_base)._M_i & 1U) == 0);
  goto LAB_0027df75;
  while (((((this->tripDetector).lineDetector.
            super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_base
          )._M_i & 1U) == 0) {
LAB_0027df31:
    do {
      if (CONNECTED < (this->txStatus)._M_i) {
LAB_0027df97:
        join_tx_rx_thread(this);
        return;
      }
      local_28.__r = 800;
      bVar1 = gmlc::concurrency::TriggerVariable::wait_for(&this->txTrigger,&local_28);
    } while (bVar1);
    uVar2 = uVar2 + 1;
    if ((uVar2 & 3) == 0) {
      (*this->_vptr_CommsInterface[6])(this);
    }
    if (uVar2 == 0xe) {
      message_00._M_str = "unable to terminate transmit connection";
      message_00._M_len = 0x27;
      logError(this,message_00);
      goto LAB_0027df97;
    }
  }
LAB_0027df75:
  LOCK();
  (this->rxStatus)._M_i = TERMINATED;
  UNLOCK();
  LOCK();
  (this->txStatus)._M_i = TERMINATED;
  UNLOCK();
  return;
}

Assistant:

void CommsInterface::disconnect()
{
    if (!operating) {
        if (propertyLock()) {
            setRxStatus(ConnectionStatus::TERMINATED);
            setTxStatus(ConnectionStatus::TERMINATED);
            propertyUnLock();
            join_tx_rx_thread();
            return;
        }
    }
    requestDisconnect.store(true, std::memory_order_release);

    if (rxStatus.load() <= ConnectionStatus::CONNECTED) {
        closeReceiver();
    }
    if (txStatus.load() <= ConnectionStatus::CONNECTED) {
        closeTransmitter();
    }
    if (tripDetector.isTripped()) {
        setRxStatus(ConnectionStatus::TERMINATED);
        setTxStatus(ConnectionStatus::TERMINATED);
        return;
    }
    int cnt = 0;
    while (rxStatus.load() <= ConnectionStatus::CONNECTED) {
        if (rxTrigger.wait_for(std::chrono::milliseconds(800))) {
            continue;
        }
        ++cnt;
        if ((cnt % 4) == 0)  // call this every 2400 milliseconds
        {
            // try calling closeReceiver again
            closeReceiver();
        }
        if (cnt == 14)  // Eventually give up
        {
            logError("unable to terminate receiver connection");
            break;
        }
        // check the trip detector
        if (tripDetector.isTripped()) {
            rxStatus = ConnectionStatus::TERMINATED;
            txStatus = ConnectionStatus::TERMINATED;
            return;
        }
    }
    cnt = 0;
    while (txStatus.load() <= ConnectionStatus::CONNECTED) {
        if (txTrigger.wait_for(std::chrono::milliseconds(800))) {
            continue;
        }
        ++cnt;
        if ((cnt % 4) == 0)  // call this every 2400 milliseconds
        {
            // try calling closeTransmitter again
            closeTransmitter();
        }
        if (cnt == 14)  // Eventually give up
        {
            logError("unable to terminate transmit connection");
            break;
        }
        // check the trip detector
        if (tripDetector.isTripped()) {
            rxStatus = ConnectionStatus::TERMINATED;
            txStatus = ConnectionStatus::TERMINATED;
            return;
        }
    }
    join_tx_rx_thread();
}